

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::loop(EventLoop *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  undefined8 in_RCX;
  nfds_t __nfds;
  shared_ptr<Channel> *it;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *__range2;
  undefined1 local_40 [32];
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> ret;
  EventLoop *this_local;
  
  ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (((this->looping_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!looping_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                  ,0x5c,"void EventLoop::loop()");
  }
  bVar1 = isInLoopThread(this);
  if (!bVar1) {
    __assert_fail("isInLoopThread()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                  ,0x5d,"void EventLoop::loop()");
  }
  this->looping_ = true;
  this->quit_ = false;
  std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::vector
            ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
             (local_40 + 0x18));
  while (((this->quit_ ^ 0xffU) & 1) != 0) {
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::clear
              ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
               (local_40 + 0x18));
    peVar2 = std::__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->poller_);
    Epoll::poll((Epoll *)local_40,(pollfd *)peVar2,__nfds,(int)in_RCX);
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::operator=
              ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
               (local_40 + 0x18),
               (vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
               local_40);
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
              ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
               local_40);
    this->eventHandling_ = true;
    __end2 = std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::
             begin((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
                   (local_40 + 0x18));
    it = (shared_ptr<Channel> *)
         std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::end
                   ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
                    (local_40 + 0x18));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::shared_ptr<Channel>_*,_std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>_>
                                  *)&it);
      if (!bVar1) break;
      this_00 = (__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<Channel>_*,_std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>_>
                ::operator*(&__end2);
      this_01 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_00);
      Channel::handleEvents(this_01);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Channel>_*,_std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>_>
      ::operator++(&__end2);
    }
    this->eventHandling_ = false;
    doPendingFunctors(this);
    peVar2 = std::__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->poller_);
    Epoll::handleExpired(peVar2);
  }
  this->looping_ = false;
  std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
            ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
             (local_40 + 0x18));
  return;
}

Assistant:

void EventLoop::loop() { //在哪个线程建立的对象，就在哪个线程执行loop
  assert(!looping_);
  assert(isInLoopThread());
  looping_ = true;
  quit_ = false;
  // LOG_TRACE << "EventLoop " << this << " start looping";
  std::vector<SP_Channel> ret;
  while (!quit_) {
    // cout << "doing" << endl;
    ret.clear();
    ret = poller_->poll();
    eventHandling_ = true;
    for (auto& it : ret) it->handleEvents();
    eventHandling_ = false;
    doPendingFunctors();
    poller_->handleExpired();
  }
  looping_ = false;
}